

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall
QTreeView::drawRow(QTreeView *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index
                  )

{
  bool bVar1;
  bool bVar2;
  QTreeViewPrivate *this_00;
  QPoint QVar3;
  QAbstractItemModel *pQVar4;
  QHeaderView *this_01;
  Data *pDVar5;
  undefined8 uVar6;
  QWidgetData *pQVar7;
  undefined1 auVar8 [16];
  undefined1 *puVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int *piVar12;
  bool bVar13;
  char cVar14;
  bool bVar15;
  Representation RVar16;
  LayoutDirection LVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  SelectionBehavior SVar23;
  Representation RVar24;
  uint uVar25;
  QWidget *pQVar26;
  QWidget *pQVar27;
  ulong uVar28;
  QStyle *pQVar29;
  long *plVar30;
  QWidget *pQVar31;
  Representation RVar32;
  uint uVar33;
  ulong uVar34;
  long in_FS_OFFSET;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  Representation local_250;
  QRect local_248;
  QRect local_238;
  QRect local_228;
  QList<QStyleOptionViewItem::ViewItemPosition> local_218;
  QList<int> local_1f8;
  undefined8 local_1d8;
  int *piStack_1d0;
  QAbstractItemModel *pQStack_1c8;
  undefined8 local_1b8;
  int *piStack_1b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_1a8;
  undefined8 local_198;
  int *piStack_190;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_188;
  undefined1 *local_178;
  undefined1 *puStack_170;
  undefined1 *local_168;
  undefined1 local_158 [8];
  undefined8 uStack_150;
  undefined1 local_148 [16];
  undefined1 *local_138;
  QPalettePrivate *pQStack_130;
  undefined1 *local_128;
  QObject *pQStack_120;
  QColor local_118;
  undefined1 local_108 [20];
  Representation RStack_f4;
  undefined8 uStack_f0;
  ColorGroup local_d8;
  QFont local_b0 [16];
  bool local_a0;
  QFlagsStorage<QStyleOptionViewItem::ViewItemFeature> local_9c;
  QLocale local_98 [6];
  QIcon local_68;
  QArrayData *local_60;
  ViewItemPosition local_48;
  QBrush local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  memset((QStyleOptionViewItem *)local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)local_108,option);
  QVar3 = (this_00->super_QAbstractItemViewPrivate).scrollDelayOffset;
  RVar16.m_i = QVar3.yp.m_i.m_i + (option->super_QStyleOption).rect.y1.m_i;
  local_168 = &DAT_aaaaaaaaaaaaaaaa;
  local_178 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_170 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = (index->m).ptr;
  if (pQVar4 == (QAbstractItemModel *)0x0) {
    local_178 = (undefined1 *)0xffffffffffffffff;
    puStack_170 = (undefined1 *)0x0;
    local_168 = (undefined1 *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar4 + 0x68))(&local_178,pQVar4,index);
  }
  this_01 = this_00->header;
  local_188.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_198 = &DAT_aaaaaaaaaaaaaaaa;
  piStack_190 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_198,(QAbstractItemView *)this);
  local_1a8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
  piStack_1b0 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)&local_1b8,&(this_00->super_QAbstractItemViewPrivate).hover);
  LVar17 = QWidget::layoutDirection((QWidget *)this);
  uVar10 = local_108._8_4_;
  bVar15 = this_00->spanning;
  if (bVar15 == true) {
    iVar18 = QHeaderView::visualIndex(this_01,0);
    iVar19 = QHeaderView::visualIndex(this_01,0);
  }
  else {
    iVar18 = (this_00->leftAndRight).first;
    iVar19 = (this_00->leftAndRight).second;
  }
  puVar9 = local_198;
  bVar1 = (this_00->super_QAbstractItemViewPrivate).alternatingColors;
  bVar2 = this_00->allColumnsShowFocus;
  if ((((int)local_198 == index->r) &&
      (pDVar5 = (this_00->super_QAbstractItemViewPrivate).editorIndexHash.d, pDVar5 != (Data *)0x0))
     && (pDVar5->size != 0)) {
    pQVar26 = QApplication::focusWidget();
    iVar20 = QHeaderView::count(this_01);
    if (iVar20 < 1) goto LAB_005a14a4;
    iVar20 = 0;
    do {
      local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_158 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      uStack_150 = (int *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (this_00->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar4 + 0x60))
                ((QModelIndex *)local_158,pQVar4,(ulong)puVar9 & 0xffffffff,iVar20,&local_178);
      pQVar27 = QAbstractItemView::indexWidget((QAbstractItemView *)this,(QModelIndex *)local_158);
      if (pQVar27 != (QWidget *)0x0) {
        pQVar31 = pQVar26;
        bVar35 = pQVar26 != (QWidget *)0x0;
        if (pQVar26 != pQVar27 && pQVar26 != (QWidget *)0x0) {
          do {
            pQVar31 = *(QWidget **)(*(long *)&pQVar31->field_0x8 + 0x10);
            bVar35 = pQVar31 != (QWidget *)0x0;
            if (pQVar31 == pQVar27) break;
          } while (pQVar31 != (QWidget *)0x0);
        }
        if (bVar35) {
          bVar35 = true;
          goto LAB_005a14ac;
        }
      }
      iVar20 = iVar20 + 1;
      iVar21 = QHeaderView::count(this_01);
    } while (iVar20 < iVar21);
    bVar35 = false;
  }
  else {
LAB_005a14a4:
    bVar35 = false;
  }
LAB_005a14ac:
  bVar13 = QWidget::hasFocus((QWidget *)this);
  if ((bVar13 & bVar2) == 1) {
    bVar36 = false;
    if (((-1 < (int)local_198) && (-1 < (long)local_198)) &&
       (local_188.ptr != (QAbstractItemModel *)0x0)) {
      iVar20 = index->r;
      if (iVar18 < 1) {
        bVar36 = false;
      }
      else {
        iVar21 = 1;
        do {
          local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_158._0_4_ = -0x55555556;
          local_158._4_4_ = -0x55555556;
          uStack_150 = (int *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar4 = (this_00->super_QAbstractItemViewPrivate).model;
          (**(code **)(*(long *)pQVar4 + 0x60))(local_158,pQVar4,iVar20,iVar21 + -1,&local_178);
          if (((local_158._0_4_ == (int)local_198) && (local_158._4_4_ == local_198._4_4_)) &&
             (uStack_150 == piStack_190)) {
            bVar36 = (QAbstractItemModel *)local_148._0_8_ == local_188.ptr;
          }
          else {
            bVar36 = false;
          }
        } while ((iVar21 < iVar18) && (iVar21 = iVar21 + 1, !bVar36));
      }
      local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_158 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      uStack_150 = (int *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (this_00->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar4 + 0x68))(local_158,pQVar4,index);
      iVar21 = QHeaderView::count(this_01);
      if ((iVar19 < iVar21) && (!bVar36)) {
        iVar21 = iVar19;
        do {
          pQVar4 = (this_00->super_QAbstractItemViewPrivate).model;
          (**(code **)(*(long *)pQVar4 + 0x60))(&local_1d8,pQVar4,iVar20,iVar21,local_158);
          if ((int)local_1d8 == (int)local_198) {
            if ((local_1d8._4_4_ != local_198._4_4_) || (piStack_1d0 != piStack_190))
            goto LAB_005a1691;
            bVar36 = pQStack_1c8 == local_188.ptr;
          }
          else {
LAB_005a1691:
            bVar36 = false;
          }
          iVar21 = iVar21 + 1;
          iVar22 = QHeaderView::count(this_01);
        } while ((iVar21 < iVar22) && (!bVar36));
      }
    }
  }
  else {
    bVar36 = false;
  }
  local_a0 = true;
  if (((this_00->super_QAbstractItemViewPrivate).selectionBehavior & SelectRows) == SelectItems) {
    local_a0 = SUB41(*(undefined4 *)&option->showDecorationSelected,0);
  }
  iVar20 = (option->super_QStyleOption).rect.y2.m_i;
  iVar21 = (option->super_QStyleOption).rect.y1.m_i;
  local_1d8 = (undefined1 *)0xffffffffffffffff;
  piStack_1d0 = (int *)0x0;
  pQStack_1c8 = (QAbstractItemModel *)0x0;
  SVar23 = QAbstractItemView::selectionBehavior((QAbstractItemView *)this);
  if (SVar23 == SelectRows) {
    pQVar4 = (index->m).ptr;
    if (pQVar4 == (QAbstractItemModel *)0x0) {
      local_158 = (undefined1  [8])0xffffffffffffffff;
      uStack_150 = (int *)0x0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_148._8_8_;
      local_148 = auVar8 << 0x40;
    }
    else {
      (**(code **)(*(long *)pQVar4 + 0x68))(local_158);
    }
    if (local_1a8.ptr == (QAbstractItemModel *)0x0) {
      local_1f8.d.d = (Data *)0xffffffffffffffff;
      local_1f8.d.ptr = (int *)0x0;
      local_1f8.d.size = 0;
      local_1f8.d.d._0_4_ = -1;
    }
    else {
      (**(code **)(*(long *)local_1a8.ptr + 0x68))(&local_1f8,local_1a8.ptr,&local_1b8);
    }
    if (local_158._0_4_ == (int)local_1f8.d.d) {
      if (((local_158._4_4_ == local_1f8.d.d._4_4_) && (uStack_150 == local_1f8.d.ptr)) &&
         (local_148._0_8_ == local_1f8.d.size)) {
        bVar37 = index->r == (int)local_1b8;
        goto LAB_005a17db;
      }
    }
    bVar37 = false;
  }
  else {
    bVar37 = false;
  }
LAB_005a17db:
  iVar20 = (iVar20 - iVar21) + 1;
  local_1f8.d.size = 0;
  local_1f8.d.d = (Data *)0x0;
  local_1f8.d.ptr = (int *)0x0;
  local_218.d.size = 0;
  local_218.d.d = (Data *)0x0;
  local_218.d.ptr = (ViewItemPosition *)0x0;
  QTreeViewPrivate::calcLogicalIndices(this_00,&local_1f8,&local_218,iVar18,iVar19);
  if (local_1f8.d.size != 0) {
    RVar24.m_i = RVar16.m_i + iVar20 + -1;
    uVar34 = 0;
    do {
      iVar18 = local_1f8.d.ptr[uVar34];
      iVar19 = QHeaderView::sectionViewportPosition
                         (*(QHeaderView **)
                           (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                      super_QFrame.super_QWidget.field_0x8 + 0x590),iVar18);
      local_250 = QVar3.xp.m_i;
      RVar32.m_i = iVar19 + local_250.m_i;
      iVar19 = QHeaderView::sectionSize(this_01,iVar18);
      if (bVar15 != false) {
        iVar21 = QHeaderView::count(this_01);
        iVar21 = QHeaderView::logicalIndex(this_01,iVar21 + -1);
        iVar22 = QHeaderView::sectionViewportPosition
                           (*(QHeaderView **)
                             (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                        super_QFrame.super_QWidget.field_0x8 + 0x590),iVar21);
        if (LVar17 == RightToLeft) {
          iVar19 = (iVar19 + RVar32.m_i) - iVar22;
          RVar32.m_i = QHeaderView::sectionViewportPosition
                                 (*(QHeaderView **)
                                   (*(long *)&(this->super_QAbstractItemView).
                                              super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                              field_0x8 + 0x590),iVar21);
        }
        else {
          iVar19 = QHeaderView::sectionSize(this_01,iVar21);
          iVar19 = (iVar22 - RVar32.m_i) + iVar19;
        }
      }
      pQVar4 = (this_00->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar4 + 0x60))(local_158,pQVar4,index->r,iVar18,&local_178);
      pQStack_1c8 = (QAbstractItemModel *)local_148._0_8_;
      local_1d8 = (undefined1 *)local_158;
      puVar9 = local_1d8;
      piStack_1d0 = uStack_150;
      local_1d8._0_4_ = local_158._0_4_;
      bVar38 = -1 < (int)local_1d8;
      local_1d8 = puVar9;
      if (((bVar38) && (-1 < (long)local_158)) &&
         ((QAbstractItemModel *)local_148._0_8_ != (QAbstractItemModel *)0x0)) {
        local_48 = local_218.d.ptr[uVar34];
        local_108._8_4_ = uVar10;
        if (bVar35) {
          local_108._8_4_ = uVar10 | 0x10000;
        }
        cVar14 = QItemSelectionModel::isSelected
                           ((QModelIndex *)
                            (this_00->super_QAbstractItemViewPrivate).selectionModel.wp.value);
        if (cVar14 != '\0') {
          local_108._8_4_ = local_108._8_4_ | 0x8000;
        }
        bVar38 = bVar36;
        if (((bVar13) && ((int)local_198 == (int)local_1d8)) &&
           ((local_198._4_4_ == local_1d8._4_4_ && (piStack_190 == piStack_1d0)))) {
          if (local_188.ptr == pQStack_1c8) {
            bVar38 = true;
          }
          if (local_188.ptr == pQStack_1c8 && (bVar2 & 1U) == 0) {
            local_108._8_4_ = local_108._8_4_ | 0x100;
            bVar38 = bVar36;
          }
        }
        bVar36 = bVar38;
        if (((bVar37) ||
            (((((int)local_1d8 == (int)local_1b8 && (local_1d8._4_4_ == local_1b8._4_4_)) &&
              (piStack_1d0 == piStack_1b0)) && (pQStack_1c8 == local_1a8.ptr)))) &&
           ((option->showDecorationSelected != false || (this_00->hoverBranch == -1)))) {
          local_108._8_4_ = local_108._8_4_ | 0x2000;
        }
        else {
          local_108._8_4_ = local_108._8_4_ & 0xffffdfff;
        }
        if ((uVar10 & 1) != 0) {
          uVar28 = (**(code **)(*(long *)(this_00->super_QAbstractItemViewPrivate).model + 0x138))()
          ;
          if ((uVar28 & 0x20) == 0) {
            local_108._8_4_ = local_108._8_4_ & 0xfffffffe;
            local_d8 = Disabled;
          }
          else {
            local_d8 = (uint)~local_108._8_4_ >> 0xf & Inactive;
          }
        }
        if (bVar1 != false) {
          local_9c.i = (local_9c.i & 0xfffffffd) + (this_00->current & 1U) * 2;
        }
        local_9c.i = local_9c.i & 0xffffffdf;
        iVar21 = this_00->treePosition;
        if (iVar21 < 0) {
          iVar21 = QHeaderView::logicalIndex(this_00->header,0);
        }
        uVar11 = local_108._8_4_;
        if (iVar21 == iVar18) {
          uVar28 = (ulong)this_00->current;
          uVar33 = 0;
          if ((-1 < (long)uVar28) && (uVar33 = 0, uVar28 < (ulong)(this_00->viewItems).d.size)) {
            uVar33 = ((uint)this_00->rootDecoration +
                     (uint)*(ushort *)&(this_00->viewItems).d.ptr[uVar28].field_0x20) *
                     this_00->indent;
          }
          local_158._0_4_ = (iVar19 + RVar32.m_i) - uVar33;
          if (LVar17 != RightToLeft) {
            local_158._0_4_ = RVar32.m_i;
          }
          local_158._4_4_ = RVar16.m_i;
          uStack_150 = (int *)CONCAT44(RVar24.m_i,(uVar33 - 1) + local_158._0_4_);
          if (iVar19 < (int)uVar33) {
            QPainter::save();
            local_228.x2.m_i = iVar19 + RVar32.m_i + -1;
            local_228.x1.m_i = RVar32.m_i;
            local_228.y1.m_i = RVar16.m_i;
            local_228.y2.m_i = RVar24.m_i;
            QPainter::setClipRect((QRect *)painter,(ClipOperation)&local_228);
          }
          bVar38 = local_a0;
          pQVar29 = QWidget::style((QWidget *)this);
          iVar18 = (**(code **)(*(long *)pQVar29 + 0xf0))(pQVar29,0x3c,local_108,this,0);
          local_a0 = iVar18 != 0;
          stack0xffffffffffffff08 = (undefined1 *)local_158;
          puVar9 = stack0xffffffffffffff08;
          uStack_f0 = uStack_150;
          piVar12 = uStack_f0;
          uStack_f0._0_4_ = (int)uStack_150;
          local_108._16_4_ = local_158._0_4_;
          if (0 < (uStack_f0._0_4_ - local_108._16_4_) + 1) {
            local_9c.i = local_9c.i | 0x60;
            unique0x10001742 = puVar9;
            uStack_f0 = piVar12;
            pQVar29 = QWidget::style((QWidget *)this);
            (**(code **)(*(long *)pQVar29 + 0xb0))(pQVar29,0x2d,local_108,painter,this);
            local_9c.i = local_9c.i & 0xffffffbf;
          }
          uVar11 = local_108._8_4_;
          local_108._8_4_ = local_108._8_4_ & 0xffff7fff;
          uVar25 = uVar33;
          if (LVar17 == RightToLeft) {
            uVar25 = 0;
          }
          RStack_f4.m_i = RVar16.m_i;
          local_108._16_4_ = uVar25 + RVar32.m_i;
          uStack_f0._4_4_ = RVar24.m_i;
          uStack_f0._0_4_ = ~uVar33 + iVar19 + uVar25 + RVar32.m_i;
          pQVar29 = QWidget::style((QWidget *)this);
          (**(code **)(*(long *)pQVar29 + 0xb0))(pQVar29,0x2d,local_108,painter,this);
          local_108._8_4_ = uVar11;
          local_a0 = bVar38;
          if (this_00->indent != 0) {
            (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget + 0x308))
                      (this,painter,local_158,index);
          }
          if (iVar19 < (int)uVar33) {
            QPainter::restore();
          }
        }
        else {
          local_108._8_4_ = local_108._8_4_ & 0xffff7fff;
          RStack_f4.m_i = RVar16.m_i;
          local_108._16_4_ = RVar32.m_i;
          uStack_f0._4_4_ = RVar24.m_i;
          uStack_f0._0_4_ = iVar19 + -1 + RVar32.m_i;
          pQVar29 = QWidget::style((QWidget *)this);
          (**(code **)(*(long *)pQVar29 + 0xb0))(pQVar29,0x2d,local_108,painter,this);
          local_108._8_4_ = uVar11;
        }
        plVar30 = (long *)(**(code **)(*(long *)&(this->super_QAbstractItemView).
                                                 super_QAbstractScrollArea.super_QFrame.
                                                 super_QWidget + 0x208))(this,&local_1d8);
        (**(code **)(*plVar30 + 0x60))(plVar30,painter,local_108,&local_1d8);
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 < (ulong)local_1f8.d.size);
  }
  if (bVar36) {
    local_118._0_6_ = 0xaaaaaaaaaaaa;
    local_118.ct.argb.red = 0xaaaa;
    local_118.ct._4_6_ = 0xaaaaaaaaaaaa;
    local_118._14_2_ = 0xaaaa;
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_120 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_138 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_130 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_158 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_150 = (int *)&DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionFocusRect::QStyleOptionFocusRect((QStyleOptionFocusRect *)local_158);
    QStyleOption::operator=((QStyleOption *)local_158,&option->super_QStyleOption);
    uStack_150 = (int *)((ulong)uStack_150 | 0x800000);
    uVar33 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i;
    QItemSelectionModel::isSelected
              ((QModelIndex *)(this_00->super_QAbstractItemViewPrivate).selectionModel.wp.value);
    plVar30 = (long *)QPalette::brush((int)option + 0x28,~uVar33 & Button);
    uVar6 = *(undefined8 *)(*plVar30 + 8);
    local_118.ct._4_6_ = (undefined6)((ulong)*(undefined8 *)(*plVar30 + 0xe) >> 0x10);
    local_118._0_6_ = SUB86(uVar6,0);
    local_118.ct.argb.red = (ushort)((ulong)uVar6 >> 0x30);
    uVar33 = 0;
    if (option->showDecorationSelected == false) {
      iVar19 = 0;
      iVar18 = QHeaderView::sectionPosition(this_01,0);
      uVar34 = (ulong)this_00->current;
      if ((-1 < (long)uVar34) && (uVar34 < (ulong)(this_00->viewItems).d.size)) {
        iVar19 = ((uint)this_00->rootDecoration +
                 (uint)*(ushort *)&(this_00->viewItems).d.ptr[uVar34].field_0x20) * this_00->indent;
      }
      uVar33 = iVar19 + iVar18;
    }
    iVar18 = QHeaderView::offset(this_01);
    iVar19 = QHeaderView::length(this_01);
    local_228.x2.m_i = ~uVar33 + (uVar33 - iVar18) + iVar19;
    RVar24.m_i = RVar16.m_i + iVar20 + -1;
    local_228.x1.m_i = uVar33 - iVar18;
    local_228.y1.m_i = RVar16.m_i;
    local_228.y2.m_i = RVar24.m_i;
    QWidget::style((QWidget *)this);
    LVar17 = QWidget::layoutDirection((QWidget *)this);
    pQVar7 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    local_238.x2.m_i = (pQVar7->crect).x2.m_i - (pQVar7->crect).x1.m_i;
    local_238.y2.m_i = (pQVar7->crect).y2.m_i - (pQVar7->crect).y1.m_i;
    local_238.x1.m_i = 0;
    local_238.y1.m_i = 0;
    local_148 = (undefined1  [16])QStyle::visualRect(LVar17,&local_238,&local_228);
    pQVar29 = QWidget::style((QWidget *)this);
    (**(code **)(*(long *)pQVar29 + 0xb0))(pQVar29,3,local_158,painter,0);
    if ((((bVar2 != false) && (option->showDecorationSelected == false)) &&
        (bVar15 = QHeaderView::sectionsMoved(this_01), bVar15)) &&
       (iVar18 = QHeaderView::visualIndex(this_01,0), iVar18 != 0)) {
      iVar18 = QHeaderView::sectionPosition(this_01,0);
      local_238._0_8_ = (ulong)(uint)RVar16.m_i << 0x20;
      local_238.y2.m_i = RVar24.m_i;
      local_238.x2.m_i = iVar18 + -1;
      QWidget::style((QWidget *)this);
      LVar17 = QWidget::layoutDirection((QWidget *)this);
      pQVar7 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)
               ->data;
      local_248.x2.m_i = (pQVar7->crect).x2.m_i - (pQVar7->crect).x1.m_i;
      local_248.y2.m_i = (pQVar7->crect).y2.m_i - (pQVar7->crect).y1.m_i;
      local_248.x1.m_i = 0;
      local_248.y1.m_i = 0;
      local_148 = (undefined1  [16])QStyle::visualRect(LVar17,&local_248,&local_238);
      pQVar29 = QWidget::style((QWidget *)this);
      (**(code **)(*(long *)pQVar29 + 0xb0))(pQVar29,3,local_158,painter,0);
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_158);
  }
  if (&(local_218.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_218.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_218.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_218.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_218.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (&(local_1f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1f8.d.d)->super_QArrayData,4,0x10);
    }
  }
  QBrush::~QBrush(local_40);
  if (local_60 != (QArrayData *)0x0) {
    LOCK();
    (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60,2,0x10);
    }
  }
  QIcon::~QIcon(&local_68);
  QLocale::~QLocale(local_98);
  QFont::~QFont(local_b0);
  QStyleOption::~QStyleOption((QStyleOption *)local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::drawRow(QPainter *painter, const QStyleOptionViewItem &option,
                        const QModelIndex &index) const
{
    Q_D(const QTreeView);
    QStyleOptionViewItem opt = option;
    const QPoint offset = d->scrollDelayOffset;
    const int y = option.rect.y() + offset.y();
    const QModelIndex parent = index.parent();
    const QHeaderView *header = d->header;
    const QModelIndex current = currentIndex();
    const QModelIndex hover = d->hover;
    const bool reverse = isRightToLeft();
    const QStyle::State state = opt.state;
    const bool spanning = d->spanning;
    const int left = (spanning ? header->visualIndex(0) : d->leftAndRight.first);
    const int right = (spanning ? header->visualIndex(0) : d->leftAndRight.second);
    const bool alternate = d->alternatingColors;
    const bool enabled = (state & QStyle::State_Enabled) != 0;
    const bool allColumnsShowFocus = d->allColumnsShowFocus;


    // when the row contains an index widget which has focus,
    // we want to paint the entire row as active
    bool indexWidgetHasFocus = false;
    if ((current.row() == index.row()) && !d->editorIndexHash.isEmpty()) {
        const int r = index.row();
        QWidget *fw = QApplication::focusWidget();
        for (int c = 0; c < header->count(); ++c) {
            QModelIndex idx = d->model->index(r, c, parent);
            if (QWidget *editor = indexWidget(idx)) {
                if (ancestorOf(editor, fw)) {
                    indexWidgetHasFocus = true;
                    break;
                }
            }
        }
    }

    const bool widgetHasFocus = hasFocus();
    bool currentRowHasFocus = false;
    if (allColumnsShowFocus && widgetHasFocus && current.isValid()) {
        // check if the focus index is before or after the visible columns
        const int r = index.row();
        for (int c = 0; c < left && !currentRowHasFocus; ++c) {
            QModelIndex idx = d->model->index(r, c, parent);
            currentRowHasFocus = (idx == current);
        }
        QModelIndex parent = d->model->parent(index);
        for (int c = right; c < header->count() && !currentRowHasFocus; ++c) {
            currentRowHasFocus = (d->model->index(r, c, parent) == current);
        }
    }

    // ### special case: if we select entire rows, then we need to draw the
    // selection in the first column all the way to the second column, rather
    // than just around the item text. We abuse showDecorationSelected to
    // indicate this to the style. Below we will reset this value temporarily
    // to only respect the styleHint while we are rendering the decoration.
    opt.showDecorationSelected = (d->selectionBehavior & SelectRows)
                                 || option.showDecorationSelected;

    int width, height = option.rect.height();
    int position;
    QModelIndex modelIndex;
    const bool hoverRow = selectionBehavior() == QAbstractItemView::SelectRows
                  && index.parent() == hover.parent()
                  && index.row() == hover.row();

    QList<int> logicalIndices;
    QList<QStyleOptionViewItem::ViewItemPosition>
            viewItemPosList; // vector of left/middle/end for each logicalIndex
    d->calcLogicalIndices(&logicalIndices, &viewItemPosList, left, right);

    for (int currentLogicalSection = 0; currentLogicalSection < logicalIndices.size(); ++currentLogicalSection) {
        int headerSection = logicalIndices.at(currentLogicalSection);
        position = columnViewportPosition(headerSection) + offset.x();
        width = header->sectionSize(headerSection);

        if (spanning) {
            int lastSection = header->logicalIndex(header->count() - 1);
            if (!reverse) {
                width = columnViewportPosition(lastSection) + header->sectionSize(lastSection) - position;
            } else {
                width += position - columnViewportPosition(lastSection);
                position = columnViewportPosition(lastSection);
            }
        }

        modelIndex = d->model->index(index.row(), headerSection, parent);
        if (!modelIndex.isValid())
            continue;
        opt.state = state;

        opt.viewItemPosition = viewItemPosList.at(currentLogicalSection);

        // fake activeness when row editor has focus
        if (indexWidgetHasFocus)
            opt.state |= QStyle::State_Active;

        if (d->selectionModel->isSelected(modelIndex))
            opt.state |= QStyle::State_Selected;
        if (widgetHasFocus && (current == modelIndex)) {
            if (allColumnsShowFocus)
                currentRowHasFocus = true;
            else
                opt.state |= QStyle::State_HasFocus;
        }
        opt.state.setFlag(QStyle::State_MouseOver,
                          (hoverRow || modelIndex == hover)
                          && (option.showDecorationSelected || d->hoverBranch == -1));

        if (enabled) {
            QPalette::ColorGroup cg;
            if ((d->model->flags(modelIndex) & Qt::ItemIsEnabled) == 0) {
                opt.state &= ~QStyle::State_Enabled;
                cg = QPalette::Disabled;
            } else if (opt.state & QStyle::State_Active) {
                cg = QPalette::Active;
            } else {
                cg = QPalette::Inactive;
            }
            opt.palette.setCurrentColorGroup(cg);
        }

        if (alternate) {
            opt.features.setFlag(QStyleOptionViewItem::Alternate, d->current & 1);
        }
        opt.features &= ~QStyleOptionViewItem::IsDecoratedRootColumn;

        /* Prior to Qt 4.3, the background of the branch (in selected state and
           alternate row color was provided by the view. For backward compatibility,
           this is now delegated to the style using PE_PanelItemViewRow which
           does the appropriate fill */
        if (d->isTreePosition(headerSection)) {
            const int i = d->indentationForItem(d->current);
            QRect branches(reverse ? position + width - i : position, y, i, height);
            const bool setClipRect = branches.width() > width;
            if (setClipRect) {
                painter->save();
                painter->setClipRect(QRect(position, y, width, height));
            }
            // draw background for the branch (selection + alternate row)

            // We use showDecorationSelected both to store the style hint, and to indicate
            // that the entire row has to be selected (see overrides of the value if
            // selectionBehavior == SelectRow).
            // While we are only painting the background we don't care for the
            // selectionBehavior factor, so respect only the style value, and reset later.
            const bool oldShowDecorationSelected = opt.showDecorationSelected;
            opt.showDecorationSelected = style()->styleHint(QStyle::SH_ItemView_ShowDecorationSelected,
                                                            &opt, this);
            opt.rect = branches;
            if (opt.rect.width() > 0) {
                // the root item also has a branch decoration
                opt.features |= QStyleOptionViewItem::IsDecoratedRootColumn;
                // we now want to draw the branch decoration
                opt.features |= QStyleOptionViewItem::IsDecorationForRootColumn;
                style()->drawPrimitive(QStyle::PE_PanelItemViewRow, &opt, painter, this);
                opt.features &= ~QStyleOptionViewItem::IsDecorationForRootColumn;
            }

            // draw background of the item (only alternate row). rest of the background
            // is provided by the delegate
            QStyle::State oldState = opt.state;
            opt.state &= ~QStyle::State_Selected;
            opt.rect.setRect(reverse ? position : i + position, y, width - i, height);
            style()->drawPrimitive(QStyle::PE_PanelItemViewRow, &opt, painter, this);
            opt.state = oldState;
            opt.showDecorationSelected = oldShowDecorationSelected;

            if (d->indent != 0)
                drawBranches(painter, branches, index);
            if (setClipRect)
                painter->restore();
        } else {
            QStyle::State oldState = opt.state;
            opt.state &= ~QStyle::State_Selected;
            opt.rect.setRect(position, y, width, height);
            style()->drawPrimitive(QStyle::PE_PanelItemViewRow, &opt, painter, this);
            opt.state = oldState;
        }

        itemDelegateForIndex(modelIndex)->paint(painter, opt, modelIndex);
    }

    if (currentRowHasFocus) {
        QStyleOptionFocusRect o;
        o.QStyleOption::operator=(option);
        o.state |= QStyle::State_KeyboardFocusChange;
        QPalette::ColorGroup cg = (option.state & QStyle::State_Enabled)
                                  ? QPalette::Normal : QPalette::Disabled;
        o.backgroundColor = option.palette.color(cg, d->selectionModel->isSelected(index)
                                                 ? QPalette::Highlight : QPalette::Window);
        int x = 0;
        if (!option.showDecorationSelected)
            x = header->sectionPosition(0) + d->indentationForItem(d->current);
        QRect focusRect(x - header->offset(), y, header->length() - x, height);
        o.rect = style()->visualRect(layoutDirection(), d->viewport->rect(), focusRect);
        style()->drawPrimitive(QStyle::PE_FrameFocusRect, &o, painter);
        // if we show focus on all columns and the first section is moved,
        // we have to split the focus rect into two rects
        if (allColumnsShowFocus && !option.showDecorationSelected
            && header->sectionsMoved() && (header->visualIndex(0) != 0)) {
            QRect sectionRect(0, y, header->sectionPosition(0), height);
            o.rect = style()->visualRect(layoutDirection(), d->viewport->rect(), sectionRect);
            style()->drawPrimitive(QStyle::PE_FrameFocusRect, &o, painter);
        }
    }
}